

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_fbs.cpp
# Opt level: O0

Status __thiscall
flatbuffers::anon_unknown_0::FBSCodeGenerator::GenerateCode
          (FBSCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  string *filename_local;
  string *path_local;
  Parser *parser_local;
  FBSCodeGenerator *this_local;
  
  bVar1 = GenerateFBS(parser,path,filename,(bool)(this->no_log_ & 1));
  this_local._4_4_ = (Status)!bVar1;
  return this_local._4_4_;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateFBS(parser, path, filename, no_log_)) { return Status::ERROR; }
    return Status::OK;
  }